

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyGraph
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  bool bVar1;
  long in_FS_OFFSET;
  bool dirty;
  bool feasible;
  Orientation in_stack_00000084;
  undefined4 in_stack_00000088;
  Orientation in_stack_0000008c;
  undefined4 in_stack_00000090;
  Orientation in_stack_00000094;
  QGraphicsAnchorLayoutPrivate *in_stack_00000098;
  undefined1 local_29;
  undefined4 in_stack_fffffffffffffff4;
  Orientation orientation_00;
  QGraphicsAnchorLayoutPrivate *this_00;
  
  this_00 = *(QGraphicsAnchorLayoutPrivate **)(in_FS_OFFSET + 0x28);
  bVar1 = QList<QGraphicsLayoutItem_*>::isEmpty((QList<QGraphicsLayoutItem_*> *)0x93a6f5);
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = simplifyVertices((QGraphicsAnchorLayoutPrivate *)
                             CONCAT44(in_stack_0000008c,in_stack_00000088),in_stack_00000084);
    if (bVar1) {
      orientation_00 = CONCAT13(1,(int3)in_stack_fffffffffffffff4);
      do {
        bVar1 = simplifyGraphIteration
                          (in_stack_00000098,in_stack_00000094,
                           (bool *)CONCAT44(in_stack_0000008c,in_stack_00000088));
        local_29 = 0;
        if (bVar1) {
          local_29 = (byte)(orientation_00 >> 0x18);
        }
      } while ((local_29 & 1) != 0);
      if ((orientation_00 & 0x1000000) == 0) {
        restoreSimplifiedGraph(this_00,orientation_00);
        restoreVertices((QGraphicsAnchorLayoutPrivate *)
                        CONCAT44(in_stack_00000094,in_stack_00000090),in_stack_0000008c);
        bVar1 = false;
      }
      else {
        bVar1 = true;
      }
    }
    else {
      restoreVertices((QGraphicsAnchorLayoutPrivate *)CONCAT44(in_stack_00000094,in_stack_00000090),
                      in_stack_0000008c);
      bVar1 = false;
    }
  }
  if (*(QGraphicsAnchorLayoutPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyGraph(Qt::Orientation orientation)
{
    if (items.isEmpty())
        return true;

#if defined(QT_DEBUG) && 0
    qDebug("Simplifying Graph for %s",
           orientation == Horizontal ? "Horizontal" : "Vertical");

    static int count = 0;
    if (orientation == Horizontal) {
        count++;
        dumpGraph(QString::fromLatin1("%1-full").arg(count));
    }
#endif

    // Vertex simplification
    if (!simplifyVertices(orientation)) {
        restoreVertices(orientation);
        return false;
    }

    // Anchor simplification
    bool dirty;
    bool feasible = true;
    do {
        dirty = simplifyGraphIteration(orientation, &feasible);
    } while (dirty && feasible);

    // Note that if we are not feasible, we fallback and make sure that the graph is fully restored
    if (!feasible) {
        restoreSimplifiedGraph(orientation);
        restoreVertices(orientation);
        return false;
    }

#if defined(QT_DEBUG) && 0
    dumpGraph(QString::fromLatin1("%1-simplified-%2").arg(count).arg(
                  QString::fromLatin1(orientation == Horizontal ? "Horizontal" : "Vertical")));
#endif

    return true;
}